

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * runInst(Machine *__return_storage_ptr__,Machine *m,Inst *i)

{
  InstTag IVar1;
  Register r;
  Machine local_348;
  int local_2d4;
  Machine local_2d0;
  Functor local_260;
  Register local_234;
  Machine local_230;
  int local_1bc;
  Machine local_1b8;
  int local_144;
  Machine local_140;
  Functor local_d0;
  Register local_94;
  Machine local_90;
  Inst *local_20;
  Inst *i_local;
  Machine *m_local;
  
  local_20 = i;
  i_local = (Inst *)m;
  m_local = __return_storage_ptr__;
  IVar1 = Inst::tag(i);
  switch(IVar1) {
  case PutStructure:
    Machine::Machine(&local_90,m);
    local_94 = Inst::get<Register>(i,0);
    Inst::get<Functor>(&local_d0,i,1);
    putStructure(__return_storage_ptr__,&local_90,local_94,&local_d0);
    Functor::~Functor(&local_d0);
    Machine::~Machine(&local_90);
    break;
  case SetVariable:
    Machine::Machine(&local_140,m);
    local_144 = (int)Inst::get<Register>(i,0);
    setVariable(__return_storage_ptr__,&local_140,(Register)local_144);
    Machine::~Machine(&local_140);
    break;
  case SetValue:
    Machine::Machine(&local_1b8,m);
    local_1bc = (int)Inst::get<Register>(i,0);
    setValue(__return_storage_ptr__,&local_1b8,(Register)local_1bc);
    Machine::~Machine(&local_1b8);
    break;
  case GetStructure:
    Machine::Machine(&local_230,m);
    local_234 = Inst::get<Register>(i,0);
    Inst::get<Functor>(&local_260,i,1);
    getStructure(__return_storage_ptr__,&local_230,local_234,&local_260);
    Functor::~Functor(&local_260);
    Machine::~Machine(&local_230);
    break;
  case UnifyVariable:
    Machine::Machine(&local_2d0,m);
    local_2d4 = (int)Inst::get<Register>(i,0);
    unifyVariable(__return_storage_ptr__,&local_2d0,(Register)local_2d4);
    Machine::~Machine(&local_2d0);
    break;
  case UnifyValue:
    Machine::Machine(&local_348,m);
    r = Inst::get<Register>(i,0);
    unifyValue(__return_storage_ptr__,&local_348,r);
    Machine::~Machine(&local_348);
    break;
  default:
    __assert_fail("false && \"unreachable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                  ,0x288,"Machine runInst(Machine, Inst)");
  }
  return __return_storage_ptr__;
}

Assistant:

Machine runInst(Machine m, Inst i) {
    switch (i.tag()) {
        case PutStructure: return putStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case SetVariable: return setVariable(m, i.get<Register>(0));
        case SetValue: return setValue(m, i.get<Register>(0));
        case GetStructure: return getStructure(m, i.get<Register>(0), i.get<Functor>(1));
        case UnifyVariable: return unifyVariable(m, i.get<Register>(0));
        case UnifyValue: return unifyValue(m, i.get<Register>(0));
    }
    assert(false && "unreachable");
}